

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp_mkdir.c
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  char *pcVar2;
  uint uVar3;
  int __fd;
  int iVar4;
  long lVar5;
  size_t sVar6;
  size_t sVar7;
  LIBSSH2_SFTP *sftp_session;
  LIBSSH2_SESSION *session;
  int rc;
  char *fingerprint;
  sockaddr_in sin;
  int auth_pw;
  int i;
  libssh2_socket_t sock;
  uint32_t hostaddr;
  char **argv_local;
  int argc_local;
  
  sin.sin_zero[0] = '\x01';
  sin.sin_zero[1] = '\0';
  sin.sin_zero[2] = '\0';
  sin.sin_zero[3] = '\0';
  sftp_session = (LIBSSH2_SFTP *)0x0;
  if (argc < 2) {
    i = htonl(0x7f000001);
  }
  else {
    i = inet_addr(argv[1]);
  }
  if (2 < argc) {
    username = argv[2];
  }
  if (3 < argc) {
    password = argv[3];
  }
  if (4 < argc) {
    sftppath = argv[4];
  }
  uVar3 = libssh2_init(0);
  if (uVar3 != 0) {
    fprintf(_stderr,"libssh2 initialization failed (%d)\n",(ulong)uVar3);
    return 1;
  }
  __fd = socket(2,1,0);
  if (__fd == -1) {
    fprintf(_stderr,"failed to create socket.\n");
  }
  else {
    fingerprint._0_2_ = 2;
    fingerprint._2_2_ = htons(0x16);
    fingerprint._4_4_ = i;
    iVar4 = connect(__fd,(sockaddr *)&fingerprint,0x10);
    if (iVar4 == 0) {
      sftp_session = (LIBSSH2_SFTP *)libssh2_session_init_ex(0,0,0);
      if (sftp_session == (LIBSSH2_SFTP *)0x0) {
        fprintf(_stderr,"Could not initialize SSH session.\n");
      }
      else {
        uVar3 = libssh2_session_handshake(sftp_session,__fd);
        if (uVar3 == 0) {
          lVar5 = libssh2_hostkey_hash(sftp_session,2);
          fprintf(_stderr,"Fingerprint: ");
          sin.sin_zero[4] = '\0';
          sin.sin_zero[5] = '\0';
          sin.sin_zero[6] = '\0';
          sin.sin_zero[7] = '\0';
          for (; (int)sin.sin_zero._4_4_ < 0x14; sin.sin_zero._4_4_ = sin.sin_zero._4_4_ + 1) {
            fprintf(_stderr,"%02X ",(ulong)*(byte *)(lVar5 + (int)sin.sin_zero._4_4_));
          }
          fprintf(_stderr,"\n");
          pcVar1 = username;
          if (sin.sin_zero._0_4_ == 0) {
            sVar6 = strlen(username);
            iVar4 = libssh2_userauth_publickey_fromfile_ex
                              (sftp_session,pcVar1,sVar6 & 0xffffffff,pubkey,privkey,password);
            if (iVar4 != 0) {
              fprintf(_stderr,"Authentication by public key failed.\n");
              goto LAB_00101652;
            }
          }
          else {
            sVar6 = strlen(username);
            pcVar2 = password;
            sVar7 = strlen(password);
            iVar4 = libssh2_userauth_password_ex
                              (sftp_session,pcVar1,sVar6 & 0xffffffff,pcVar2,sVar7 & 0xffffffff,0);
            if (iVar4 != 0) {
              fprintf(_stderr,"Authentication by password failed.\n");
              goto LAB_00101652;
            }
          }
          lVar5 = libssh2_sftp_init(sftp_session);
          if (lVar5 == 0) {
            fprintf(_stderr,"Unable to init SFTP session\n");
          }
          else {
            libssh2_session_set_blocking(sftp_session,1);
            pcVar1 = sftppath;
            sVar6 = strlen(sftppath);
            uVar3 = libssh2_sftp_mkdir_ex(lVar5,pcVar1,sVar6 & 0xffffffff,0x1ed);
            if (uVar3 != 0) {
              fprintf(_stderr,"libssh2_sftp_mkdir failed: %d\n",(ulong)uVar3);
            }
            libssh2_sftp_shutdown(lVar5);
          }
        }
        else {
          fprintf(_stderr,"Failure establishing SSH session: %d\n",(ulong)uVar3);
        }
      }
    }
    else {
      fprintf(_stderr,"failed to connect.\n");
    }
  }
LAB_00101652:
  if (sftp_session != (LIBSSH2_SFTP *)0x0) {
    libssh2_session_disconnect_ex(sftp_session,0xb,"Normal Shutdown","");
    libssh2_session_free(sftp_session);
  }
  if (__fd != -1) {
    shutdown(__fd,2);
    close(__fd);
  }
  fprintf(_stderr,"all done\n");
  libssh2_exit();
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
    uint32_t hostaddr;
    libssh2_socket_t sock;
    int i, auth_pw = 1;
    struct sockaddr_in sin;
    const char *fingerprint;
    int rc;
    LIBSSH2_SESSION *session = NULL;
    LIBSSH2_SFTP *sftp_session;

#ifdef _WIN32
    WSADATA wsadata;

    rc = WSAStartup(MAKEWORD(2, 0), &wsadata);
    if(rc) {
        fprintf(stderr, "WSAStartup failed with error: %d\n", rc);
        return 1;
    }
#endif

    if(argc > 1) {
        hostaddr = inet_addr(argv[1]);
    }
    else {
        hostaddr = htonl(0x7F000001);
    }
    if(argc > 2) {
        username = argv[2];
    }
    if(argc > 3) {
        password = argv[3];
    }
    if(argc > 4) {
        sftppath = argv[4];
    }

    rc = libssh2_init(0);
    if(rc) {
        fprintf(stderr, "libssh2 initialization failed (%d)\n", rc);
        return 1;
    }

    /*
     * The application code is responsible for creating the socket
     * and establishing the connection
     */
    sock = socket(AF_INET, SOCK_STREAM, 0);
    if(sock == LIBSSH2_INVALID_SOCKET) {
        fprintf(stderr, "failed to create socket.\n");
        goto shutdown;
    }

    sin.sin_family = AF_INET;
    sin.sin_port = htons(22);
    sin.sin_addr.s_addr = hostaddr;
    if(connect(sock, (struct sockaddr*)(&sin), sizeof(struct sockaddr_in))) {
        fprintf(stderr, "failed to connect.\n");
        goto shutdown;
    }

    /* Create a session instance */
    session = libssh2_session_init();
    if(!session) {
        fprintf(stderr, "Could not initialize SSH session.\n");
        goto shutdown;
    }

    /* ... start it up. This will trade welcome banners, exchange keys,
     * and setup crypto, compression, and MAC layers
     */
    rc = libssh2_session_handshake(session, sock);
    if(rc) {
        fprintf(stderr, "Failure establishing SSH session: %d\n", rc);
        goto shutdown;
    }

    /* At this point we have not yet authenticated.  The first thing to do
     * is check the hostkey's fingerprint against our known hosts Your app
     * may have it hard coded, may go to a file, may present it to the
     * user, that's your call
     */
    fingerprint = libssh2_hostkey_hash(session, LIBSSH2_HOSTKEY_HASH_SHA1);
    fprintf(stderr, "Fingerprint: ");
    for(i = 0; i < 20; i++) {
        fprintf(stderr, "%02X ", (unsigned char)fingerprint[i]);
    }
    fprintf(stderr, "\n");

    if(auth_pw) {
        /* We could authenticate via password */
        if(libssh2_userauth_password(session, username, password)) {
            fprintf(stderr, "Authentication by password failed.\n");
            goto shutdown;
        }
    }
    else {
        /* Or by public key */
        if(libssh2_userauth_publickey_fromfile(session, username,
                                               pubkey, privkey,
                                               password)) {
            fprintf(stderr, "Authentication by public key failed.\n");
            goto shutdown;
        }
    }

    sftp_session = libssh2_sftp_init(session);

    if(!sftp_session) {
        fprintf(stderr, "Unable to init SFTP session\n");
        goto shutdown;
    }

    /* Since we have not set non-blocking, tell libssh2 we are blocking */
    libssh2_session_set_blocking(session, 1);

    /* Make a directory via SFTP */
    rc = libssh2_sftp_mkdir(sftp_session, sftppath,
                            LIBSSH2_SFTP_S_IRWXU |
                            LIBSSH2_SFTP_S_IRGRP |
                            LIBSSH2_SFTP_S_IXGRP |
                            LIBSSH2_SFTP_S_IROTH |
                            LIBSSH2_SFTP_S_IXOTH);
    if(rc)
        fprintf(stderr, "libssh2_sftp_mkdir failed: %d\n", rc);

    libssh2_sftp_shutdown(sftp_session);

shutdown:

    if(session) {
        libssh2_session_disconnect(session, "Normal Shutdown");
        libssh2_session_free(session);
    }

    if(sock != LIBSSH2_INVALID_SOCKET) {
        shutdown(sock, 2);
        LIBSSH2_SOCKET_CLOSE(sock);
    }

    fprintf(stderr, "all done\n");

    libssh2_exit();

#ifdef _WIN32
    WSACleanup();
#endif

    return 0;
}